

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

HalfedgeMesh * __thiscall CMU462::HalfedgeMesh::operator=(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *__position;
  _List_node_base *p_Var1;
  HalfedgeMesh *pHVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  HalfedgeMesh *pHVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  halfedgeOldToNew;
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  faceOldToNew;
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  edgeOldToNew;
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  vertexOldToNew;
  key_type local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  _List_node_base *local_100;
  HalfedgeMesh *local_f8;
  _Rb_tree<std::_List_const_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  local_f0;
  _Rb_tree<std::_List_const_iterator<CMU462::Face>,_std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  local_c0;
  _Rb_tree<std::_List_const_iterator<CMU462::Edge>,_std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  local_90;
  _Rb_tree<std::_List_const_iterator<CMU462::Vertex>,_std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_60;
  
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  __position = &this->vertices;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear(__position);
  local_110 = (_List_node_base *)&this->edges;
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear
            ((list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)local_110);
  local_100 = (_List_node_base *)&this->faces;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_100);
  local_108 = (_List_node_base *)&this->boundaries;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_108);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_node = (_List_node_base *)mesh;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    local_118._M_node =
         (((HalfedgeMesh *)local_118._M_node)->halfedges).
         super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
         super__List_node_base._M_next;
    if ((HalfedgeMesh *)local_118._M_node == mesh) break;
    iVar3 = std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::insert
                      (&this->halfedges,(const_iterator)this,
                       (value_type *)
                       &(((HalfedgeMesh *)local_118._M_node)->halfedges).
                        super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
                        _M_impl._M_node._M_size);
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    pmVar4->_M_node = iVar3._M_node;
  }
  local_118._M_node = (_List_node_base *)&mesh->vertices;
  local_f8 = this;
  while( true ) {
    local_118._M_node =
         (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
          &(local_118._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_118._M_node == (_List_node_base *)&mesh->vertices) break;
    iVar5 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::insert
                      (__position,(const_iterator)__position,(value_type *)(local_118._M_node + 1));
    pmVar6 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)&local_60,(key_type *)&local_118);
    pmVar6->_M_node = iVar5._M_node;
  }
  local_118._M_node = (_List_node_base *)&mesh->edges;
  while( true ) {
    local_118._M_node =
         (((_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)&(local_118._M_node)->_M_next)
         ->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_118._M_node == (_List_node_base *)&mesh->edges) break;
    iVar7 = std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::insert
                      (local_110,local_110,(value_type *)(local_118._M_node + 1));
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)&local_90,(key_type *)&local_118);
    pmVar8->_M_node = iVar7._M_node;
  }
  local_118._M_node = (_List_node_base *)&mesh->faces;
  while( true ) {
    pHVar2 = local_f8;
    local_118._M_node =
         (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&(local_118._M_node)->_M_next)
         ->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_118._M_node == (_List_node_base *)&mesh->faces) break;
    iVar9 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                      (local_100,local_100,(value_type *)(local_118._M_node + 1));
    pmVar10 = std::
              map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                            *)&local_c0,(key_type *)&local_118);
    pmVar10->_M_node = iVar9._M_node;
  }
  local_118._M_node = (_List_node_base *)&mesh->boundaries;
  while( true ) {
    local_118._M_node = (local_118._M_node)->_M_next;
    if (local_118._M_node == (_List_node_base *)&mesh->boundaries) break;
    iVar9 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                      (local_108,local_108,(value_type *)(local_118._M_node + 1));
    pmVar10 = std::
              map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                            *)&local_c0,(key_type *)&local_118);
    pmVar10->_M_node = iVar9._M_node;
  }
  pHVar11 = pHVar2;
  while (p_Var13 = local_100,
        pHVar11 = (HalfedgeMesh *)
                  (pHVar11->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node.super__List_node_base._M_next, pHVar11 != pHVar2) {
    local_118._M_node =
         (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
         _M_impl._M_node.super__List_node_base._M_prev;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
    _M_node.super__List_node_base._M_prev = pmVar4->_M_node;
    local_118._M_node =
         (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
    _M_node.super__List_node_base._M_next = pmVar4->_M_node;
    local_118._M_node =
         (_List_node_base *)
         (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
         _M_impl._M_node._M_size;
    pmVar6 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)&local_60,(key_type *)&local_118);
    (pHVar11->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
    _M_node._M_size = (size_t)pmVar6->_M_node;
    local_118._M_node =
         (pHVar11->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)&local_90,(key_type *)&local_118);
    (pHVar11->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
    super__List_node_base._M_next = pmVar8->_M_node;
    local_118._M_node =
         (pHVar11->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
         _M_node.super__List_node_base._M_prev;
    pmVar10 = std::
              map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                            *)&local_c0,(key_type *)&local_118);
    (pHVar11->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
    super__List_node_base._M_prev = pmVar10->_M_node;
  }
  p_Var12 = (_List_node_base *)__position;
  while (p_Var1 = local_108,
        p_Var12 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var12->_M_next
                   )->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)__position) {
    local_118._M_node = p_Var12[0xf]._M_prev;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    p_Var12[0xf]._M_prev = pmVar4->_M_node;
  }
  p_Var12 = local_110;
  while (p_Var12 = (((_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)&p_Var12->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next, p_Var12 != local_110) {
    local_118._M_node = p_Var12[6]._M_prev;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    p_Var12[6]._M_prev = pmVar4->_M_node;
  }
  p_Var12 = p_Var13;
  while (p_Var12 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var12->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next, p_Var12 != p_Var13) {
    local_118._M_node = p_Var12[0xb]._M_prev;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    p_Var12[0xb]._M_prev = pmVar4->_M_node;
  }
  p_Var13 = p_Var1;
  while (p_Var13 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var13->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next, p_Var13 != p_Var1) {
    local_118._M_node = p_Var13[0xb]._M_prev;
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&local_f0,&local_118);
    p_Var13[0xb]._M_prev = pmVar4->_M_node;
  }
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Face>,_std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Edge>,_std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Vertex>,_std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::~_Rb_tree(&local_f0);
  return pHVar2;
}

Assistant:

const HalfedgeMesh& HalfedgeMesh::operator=(const HalfedgeMesh& mesh)
    // The assignment operator does a "deep" copy of the halfedge mesh data
    // structure; in other words, it makes new instances of each mesh element, and
    // ensures that pointers in the copy point to the newly allocated elements
    // rather than elements in the original mesh.  This behavior is especially
    // important for making assignments, since the mesh on the right-hand side of an
    // assignment may be temporary (hence any pointers to elements in this mesh will
    // become invalid as soon as it is released.)
  {
    // Clear any existing elements.
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // These maps will be used to identify elements of the old mesh
    // with elements of the new mesh.  (Note that we can use a single
    // map for both interior and boundary faces, because the map
    // doesn't care which list of faces these iterators come from.)
    map<HalfedgeCIter, HalfedgeIter> halfedgeOldToNew;
    map<VertexCIter, VertexIter> vertexOldToNew;
    map<EdgeCIter, EdgeIter> edgeOldToNew;
    map<FaceCIter, FaceIter> faceOldToNew;

    // Copy geometry from the original mesh and create a map from
    // pointers in the original mesh to those in the new mesh.
    for (HalfedgeCIter h = mesh.halfedgesBegin(); h != mesh.halfedgesEnd(); h++)
      halfedgeOldToNew[h] = halfedges.insert(halfedges.end(), *h);
    for (VertexCIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++)
      vertexOldToNew[v] = vertices.insert(vertices.end(), *v);
    for (EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++)
      edgeOldToNew[e] = edges.insert(edges.end(), *e);
    for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++)
      faceOldToNew[f] = faces.insert(faces.end(), *f);
    for (FaceCIter b = mesh.boundariesBegin(); b != mesh.boundariesEnd(); b++)
      faceOldToNew[b] = boundaries.insert(boundaries.end(), *b);

    // "Search and replace" old pointers with new ones.
    for (HalfedgeIter he = halfedgesBegin(); he != halfedgesEnd(); he++) {
      he->next() = halfedgeOldToNew[he->next()];
      he->twin() = halfedgeOldToNew[he->twin()];
      he->vertex() = vertexOldToNew[he->vertex()];
      he->edge() = edgeOldToNew[he->edge()];
      he->face() = faceOldToNew[he->face()];
    }
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++)
      v->halfedge() = halfedgeOldToNew[v->halfedge()];
    for (EdgeIter e = edgesBegin(); e != edgesEnd(); e++)
      e->halfedge() = halfedgeOldToNew[e->halfedge()];
    for (FaceIter f = facesBegin(); f != facesEnd(); f++)
      f->halfedge() = halfedgeOldToNew[f->halfedge()];
    for (FaceIter b = boundariesBegin(); b != boundariesEnd(); b++)
      b->halfedge() = halfedgeOldToNew[b->halfedge()];

    // Return a reference to the new mesh.
    return *this;
  }